

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O0

void ImGui::UpdateManualResize
               (ImGuiWindow *window,ImVec2 *size_auto_fit,int *border_held,int resize_grip_count,
               ImU32 *resize_grip_col)

{
  ImU32 IVar1;
  float in_ECX;
  ImGuiMouseCursor IVar2;
  uint *in_RDX;
  undefined8 *in_RSI;
  ImGuiWindow *in_RDI;
  ImVec2 in_R8;
  float fVar3;
  ImVec2 IVar4;
  ImRect IVar5;
  float NAV_RESIZE_SPEED;
  ImVec2 nav_resize_delta;
  ImVec2 border_posn;
  ImVec2 border_target;
  ImRect border_rect;
  bool held_1;
  bool hovered_1;
  int border_n;
  ImVec2 corner_target;
  bool held;
  bool hovered;
  ImRect resize_rect;
  ImVec2 corner;
  ImGuiResizeGripDef *grip;
  int resize_grip_n;
  ImVec2 size_target;
  ImVec2 pos_target;
  float grip_hover_outer_size;
  float grip_hover_inner_size;
  float grip_draw_size;
  int resize_border_count;
  ImGuiWindowFlags flags;
  ImGuiContext *g;
  undefined4 in_stack_fffffffffffffe68;
  float in_stack_fffffffffffffe6c;
  ImGuiWindow *in_stack_fffffffffffffe70;
  ImVec2 *in_stack_fffffffffffffe78;
  float in_stack_fffffffffffffe80;
  float in_stack_fffffffffffffe84;
  ImVec2 *in_stack_fffffffffffffe88;
  ImGuiWindow *in_stack_fffffffffffffe90;
  undefined4 in_stack_fffffffffffffe98;
  undefined4 uVar6;
  float in_stack_fffffffffffffea4;
  ImGuiInputReadMode in_stack_fffffffffffffea8;
  ImGuiNavDirSourceFlags in_stack_fffffffffffffeac;
  undefined4 in_stack_fffffffffffffeb0;
  undefined4 in_stack_fffffffffffffeb4;
  ImVec2 in_stack_fffffffffffffec0;
  ImVec2 in_stack_fffffffffffffec8;
  ImVec2 local_130;
  ImVec2 local_128;
  ImVec2 local_120;
  ImVec2 local_118;
  ImVec2 local_110;
  ImVec2 local_108;
  ImVec2 local_100;
  ImVec2 local_f8;
  ImVec2 local_f0;
  byte local_e6;
  byte local_e5;
  uint local_e4;
  ImVec2 local_e0;
  ImVec2 local_d8;
  ImVec2 local_d0;
  ImVec2 local_c8;
  ImVec2 local_c0;
  undefined8 local_b8;
  ImVec2 local_ac;
  byte local_a2;
  byte local_a1;
  ImVec2 local_a0;
  ImVec2 local_98;
  ImVec2 local_90;
  ImVec2 local_88;
  ImRect local_80;
  ImVec2 local_70;
  undefined1 local_68 [16];
  float local_58;
  ImVec2 local_54;
  ImVec2 local_4c;
  float local_44;
  float local_40;
  float local_3c;
  float local_38;
  float local_34;
  ImVec2 local_30;
  ImVec2 local_28;
  float local_1c;
  uint *local_18;
  undefined8 *local_10;
  ImGuiWindow *local_8;
  
  local_30 = (ImVec2)GImGui;
  local_34 = (float)in_RDI->Flags;
  if (((uint)local_34 & 2) != 0) {
    return;
  }
  if (((uint)local_34 & 0x40) != 0) {
    return;
  }
  if (0 < in_RDI->AutoFitFramesX) {
    return;
  }
  if (0 < in_RDI->AutoFitFramesY) {
    return;
  }
  if ((in_RDI->WasActive & 1U) == 0) {
    return;
  }
  local_38 = 0.0;
  if (((GImGui->IO).ConfigWindowsResizeFromEdges & 1U) != 0) {
    local_38 = 5.60519e-45;
  }
  local_28 = in_R8;
  local_1c = in_ECX;
  local_18 = in_RDX;
  local_10 = in_RSI;
  local_8 = in_RDI;
  fVar3 = ImMax<float>(GImGui->FontSize * 1.35,GImGui->FontSize * 0.2 + in_RDI->WindowRounding + 1.0
                      );
  local_3c = (float)(int)fVar3;
  local_40 = (float)(int)(local_3c * 0.75);
  uVar6 = 0;
  fVar3 = 4.0;
  if ((*(bool *)((long)local_30 + 0xd3) & 1U) == 0) {
    fVar3 = 0.0;
  }
  local_44 = fVar3;
  ImVec2::ImVec2((ImVec2 *)(local_68 + 0x1c),3.4028235e+38,3.4028235e+38);
  ImVec2::ImVec2((ImVec2 *)(local_68 + 0x14),3.4028235e+38,3.4028235e+38);
  PushID((char *)CONCAT44(in_stack_fffffffffffffe84,in_stack_fffffffffffffe80));
  for (local_58 = 0.0; (int)local_58 < (int)local_1c; local_58 = (float)((int)local_58 + 1)) {
    local_68._8_8_ = resize_grip_def + (int)local_58;
    in_stack_fffffffffffffe88 = &local_8->Pos;
    local_70 = operator+((ImVec2 *)CONCAT44(in_stack_fffffffffffffe6c,in_stack_fffffffffffffe68),
                         (ImVec2 *)0x12e9b0);
    local_68._0_8_ =
         ImLerp(in_stack_fffffffffffffe78,(ImVec2 *)in_stack_fffffffffffffe70,
                (ImVec2 *)CONCAT44(in_stack_fffffffffffffe6c,in_stack_fffffffffffffe68));
    local_90 = operator*((ImVec2 *)CONCAT44(in_stack_fffffffffffffe6c,in_stack_fffffffffffffe68),0.0
                        );
    in_stack_fffffffffffffe90 = (ImGuiWindow *)local_68;
    local_88 = operator-((ImVec2 *)CONCAT44(in_stack_fffffffffffffe6c,in_stack_fffffffffffffe68),
                         (ImVec2 *)0x12ea19);
    local_a0 = operator*((ImVec2 *)CONCAT44(in_stack_fffffffffffffe6c,in_stack_fffffffffffffe68),0.0
                        );
    local_98 = operator+((ImVec2 *)CONCAT44(in_stack_fffffffffffffe6c,in_stack_fffffffffffffe68),
                         (ImVec2 *)0x12ea57);
    ImRect::ImRect(&local_80,&local_88,&local_98);
    if (local_80.Max.x < local_80.Min.x) {
      ImSwap<float>((float *)&local_80,&local_80.Max.x);
    }
    if (local_80.Max.y < local_80.Min.y) {
      ImSwap<float>(&local_80.Min.y,&local_80.Max.y);
    }
    ImGuiWindow::GetID(in_stack_fffffffffffffe70,
                       (void *)CONCAT44(in_stack_fffffffffffffe6c,in_stack_fffffffffffffe68));
    ButtonBehavior((ImRect *)CONCAT44(in_stack_fffffffffffffeac,in_stack_fffffffffffffea8),
                   (ImGuiID)in_stack_fffffffffffffea4,
                   (bool *)CONCAT44(uVar6,in_stack_fffffffffffffe98),
                   (bool *)in_stack_fffffffffffffe90,
                   (ImGuiButtonFlags)((ulong)in_stack_fffffffffffffe88 >> 0x20));
    if (((local_a1 & 1) != 0) || ((local_a2 & 1) != 0)) {
      IVar2 = 6;
      if (((uint)local_58 & 1) != 0) {
        IVar2 = 5;
      }
      *(ImGuiMouseCursor *)((long)local_30 + 0x1d70) = IVar2;
    }
    if ((((local_a2 & 1) == 0) || ((*(bool *)((long)local_30 + 0x425) & 1U) == 0)) ||
       (local_58 != 0.0)) {
      if ((local_a2 & 1) != 0) {
        local_c8 = operator-((ImVec2 *)CONCAT44(in_stack_fffffffffffffe6c,in_stack_fffffffffffffe68)
                             ,(ImVec2 *)0x12ebf0);
        local_d8 = operator*((ImVec2 *)CONCAT44(in_stack_fffffffffffffe6c,in_stack_fffffffffffffe68)
                             ,0.0);
        local_e0 = operator*((ImVec2 *)CONCAT44(in_stack_fffffffffffffe6c,in_stack_fffffffffffffe68)
                             ,0.0);
        local_d0 = ImLerp(in_stack_fffffffffffffe78,(ImVec2 *)in_stack_fffffffffffffe70,
                          (ImVec2 *)CONCAT44(in_stack_fffffffffffffe6c,in_stack_fffffffffffffe68));
        local_c0 = operator+((ImVec2 *)CONCAT44(in_stack_fffffffffffffe6c,in_stack_fffffffffffffe68)
                             ,(ImVec2 *)0x12ec85);
        CalcResizePosSizeFromAnyCorner
                  ((ImGuiWindow *)CONCAT44(in_stack_fffffffffffffeb4,in_stack_fffffffffffffeb0),
                   (ImVec2 *)CONCAT44(in_stack_fffffffffffffeac,in_stack_fffffffffffffea8),
                   (ImVec2 *)CONCAT44(in_stack_fffffffffffffea4,fVar3),
                   (ImVec2 *)CONCAT44(uVar6,in_stack_fffffffffffffe98),
                   (ImVec2 *)in_stack_fffffffffffffe90);
      }
    }
    else {
      local_b8 = *local_10;
      local_ac = CalcSizeAfterConstraint
                           ((ImGuiWindow *)in_stack_fffffffffffffec0,in_stack_fffffffffffffec8);
      local_54 = local_ac;
      ClearActiveID();
    }
    if (((local_58 == 0.0) || ((local_a2 & 1) != 0)) || ((local_a1 & 1) != 0)) {
      if ((local_a2 & 1) == 0) {
        in_stack_fffffffffffffe84 = 4.2039e-44;
        if ((local_a1 & 1) != 0) {
          in_stack_fffffffffffffe84 = 4.34403e-44;
        }
      }
      else {
        in_stack_fffffffffffffe84 = 4.48416e-44;
      }
      IVar1 = GetColorU32((ImGuiCol)in_stack_fffffffffffffe84,in_stack_fffffffffffffe80);
      *(ImU32 *)((long)local_28 + (long)(int)local_58 * 4) = IVar1;
    }
  }
  for (local_e4 = 0; (int)local_e4 < (int)local_38; local_e4 = local_e4 + 1) {
    IVar5 = GetResizeBorderRect(in_stack_fffffffffffffe90,
                                (int)((ulong)in_stack_fffffffffffffe88 >> 0x20),
                                SUB84(in_stack_fffffffffffffe88,0),in_stack_fffffffffffffe84);
    local_f8 = IVar5.Min;
    local_f0 = IVar5.Max;
    ImGuiWindow::GetID(in_stack_fffffffffffffe70,
                       (void *)CONCAT44(in_stack_fffffffffffffe6c,in_stack_fffffffffffffe68));
    ButtonBehavior((ImRect *)CONCAT44(in_stack_fffffffffffffeac,in_stack_fffffffffffffea8),
                   (ImGuiID)in_stack_fffffffffffffea4,
                   (bool *)CONCAT44(uVar6,in_stack_fffffffffffffe98),
                   (bool *)in_stack_fffffffffffffe90,
                   (ImGuiButtonFlags)((ulong)in_stack_fffffffffffffe88 >> 0x20));
    if ((((local_e5 & 1) != 0) && (0.04 < *(float *)((long)local_30 + 0x1a1c))) ||
       ((local_e6 & 1) != 0)) {
      IVar2 = 3;
      if ((local_e4 & 1) != 0) {
        IVar2 = 4;
      }
      *(ImGuiMouseCursor *)((long)local_30 + 0x1d70) = IVar2;
      if ((local_e6 & 1) != 0) {
        *local_18 = local_e4;
      }
    }
    if ((local_e6 & 1) != 0) {
      local_100 = local_8->Pos;
      ImVec2::ImVec2(&local_108);
      if (local_e4 == 0) {
        ImVec2::ImVec2(&local_110,0.0,0.0);
        local_108 = local_110;
        local_100.y = (*(float *)((long)local_30 + 0x134) - *(float *)((long)local_30 + 0x1a44)) +
                      4.0;
      }
      if (local_e4 == 1) {
        ImVec2::ImVec2(&local_118,1.0,0.0);
        local_108 = local_118;
        local_100.x = (((ImVec2 *)((long)local_30 + 0x130))->x -
                      ((ImVec2 *)((long)local_30 + 0x1a40))->x) + 4.0;
      }
      if (local_e4 == 2) {
        ImVec2::ImVec2(&local_120,0.0,1.0);
        local_108 = local_120;
        local_100.y = (*(float *)((long)local_30 + 0x134) - *(float *)((long)local_30 + 0x1a44)) +
                      4.0;
      }
      if (local_e4 == 3) {
        ImVec2::ImVec2(&local_128,0.0,0.0);
        local_108 = local_128;
        local_100.x = (((ImVec2 *)((long)local_30 + 0x130))->x -
                      ((ImVec2 *)((long)local_30 + 0x1a40))->x) + 4.0;
      }
      CalcResizePosSizeFromAnyCorner
                ((ImGuiWindow *)CONCAT44(in_stack_fffffffffffffeb4,in_stack_fffffffffffffeb0),
                 (ImVec2 *)CONCAT44(in_stack_fffffffffffffeac,in_stack_fffffffffffffea8),
                 (ImVec2 *)CONCAT44(in_stack_fffffffffffffea4,fVar3),
                 (ImVec2 *)CONCAT44(uVar6,in_stack_fffffffffffffe98),
                 (ImVec2 *)in_stack_fffffffffffffe90);
    }
  }
  PopID();
  if ((*(ImGuiWindow **)((long)local_30 + 0x1b80) != (ImGuiWindow *)0x0) &&
     ((*(ImGuiWindow **)((long)local_30 + 0x1b80))->RootWindow == local_8)) {
    ImVec2::ImVec2(&local_130);
    if ((*(ImGuiInputSource *)((long)local_30 + 0x1b68) == ImGuiInputSource_NavKeyboard) &&
       ((*(bool *)((long)local_30 + 0x149) & 1U) != 0)) {
      in_stack_fffffffffffffec8 =
           GetNavInputAmount2d(in_stack_fffffffffffffeac,in_stack_fffffffffffffea8,
                               in_stack_fffffffffffffea4,fVar3);
      local_130 = in_stack_fffffffffffffec8;
    }
    if (*(ImGuiInputSource *)((long)local_30 + 0x1b68) == ImGuiInputSource_NavGamepad) {
      in_stack_fffffffffffffec0 =
           GetNavInputAmount2d(in_stack_fffffffffffffeac,in_stack_fffffffffffffea8,
                               in_stack_fffffffffffffea4,fVar3);
      local_130 = in_stack_fffffffffffffec0;
    }
    if ((local_130.x == 0.0) && (!NAN(local_130.x))) {
      if ((local_130.y == 0.0) && (!NAN(local_130.y))) goto LAB_0012f212;
    }
    in_stack_fffffffffffffe6c = *(float *)((long)local_30 + 0x18) * 600.0;
    fVar3 = ImMin<float>(((ImVec2 *)((long)local_30 + 0xb8))->x,*(float *)((long)local_30 + 0xbc));
    fVar3 = ImFloor(in_stack_fffffffffffffe6c * fVar3);
    operator*=(&local_130,fVar3);
    *(bool *)((long)local_30 + 0x1ba0) = false;
    *(bool *)((long)local_30 + 0x1baf) = true;
    IVar1 = GetColorU32((ImGuiCol)in_stack_fffffffffffffe84,in_stack_fffffffffffffe80);
    *(ImU32 *)local_28 = IVar1;
    operator+((ImVec2 *)CONCAT44(in_stack_fffffffffffffe6c,in_stack_fffffffffffffe68),
              (ImVec2 *)0x12f1e7);
    local_54 = CalcSizeAfterConstraint
                         ((ImGuiWindow *)in_stack_fffffffffffffec0,in_stack_fffffffffffffec8);
  }
LAB_0012f212:
  if ((local_54.x != 3.4028235e+38) || (NAN(local_54.x))) {
    local_8->SizeFull = local_54;
    MarkIniSettingsDirty(local_8);
  }
  if ((local_4c.x != 3.4028235e+38) || (NAN(local_4c.x))) {
    IVar4 = ImFloor((ImVec2 *)CONCAT44(in_stack_fffffffffffffe6c,in_stack_fffffffffffffe68));
    local_8->Pos = IVar4;
    MarkIniSettingsDirty(local_8);
  }
  local_8->Size = local_8->SizeFull;
  return;
}

Assistant:

static void ImGui::UpdateManualResize(ImGuiWindow* window, const ImVec2& size_auto_fit, int* border_held, int resize_grip_count, ImU32 resize_grip_col[4])
{
    ImGuiContext& g = *GImGui;
    ImGuiWindowFlags flags = window->Flags;
    if ((flags & ImGuiWindowFlags_NoResize) || (flags & ImGuiWindowFlags_AlwaysAutoResize) || window->AutoFitFramesX > 0 || window->AutoFitFramesY > 0)
        return;
    if (window->WasActive == false) // Early out to avoid running this code for e.g. an hidden implicit/fallback Debug window.
        return;

    const int resize_border_count = g.IO.ConfigWindowsResizeFromEdges ? 4 : 0;
    const float grip_draw_size = (float)(int)ImMax(g.FontSize * 1.35f, window->WindowRounding + 1.0f + g.FontSize * 0.2f);
    const float grip_hover_inner_size = (float)(int)(grip_draw_size * 0.75f);
    const float grip_hover_outer_size = g.IO.ConfigWindowsResizeFromEdges ? WINDOWS_RESIZE_FROM_EDGES_HALF_THICKNESS : 0.0f;

    ImVec2 pos_target(FLT_MAX, FLT_MAX);
    ImVec2 size_target(FLT_MAX, FLT_MAX);

    // Manual resize grips
    PushID("#RESIZE");
    for (int resize_grip_n = 0; resize_grip_n < resize_grip_count; resize_grip_n++)
    {
        const ImGuiResizeGripDef& grip = resize_grip_def[resize_grip_n];
        const ImVec2 corner = ImLerp(window->Pos, window->Pos + window->Size, grip.CornerPos);

        // Using the FlattenChilds button flag we make the resize button accessible even if we are hovering over a child window
        ImRect resize_rect(corner - grip.InnerDir * grip_hover_outer_size, corner + grip.InnerDir * grip_hover_inner_size);
        if (resize_rect.Min.x > resize_rect.Max.x) ImSwap(resize_rect.Min.x, resize_rect.Max.x);
        if (resize_rect.Min.y > resize_rect.Max.y) ImSwap(resize_rect.Min.y, resize_rect.Max.y);
        bool hovered, held;
        ButtonBehavior(resize_rect, window->GetID((void*)(intptr_t)resize_grip_n), &hovered, &held, ImGuiButtonFlags_FlattenChildren | ImGuiButtonFlags_NoNavFocus);
        //GetOverlayDrawList(window)->AddRect(resize_rect.Min, resize_rect.Max, IM_COL32(255, 255, 0, 255));
        if (hovered || held)
            g.MouseCursor = (resize_grip_n & 1) ? ImGuiMouseCursor_ResizeNESW : ImGuiMouseCursor_ResizeNWSE;

        if (held && g.IO.MouseDoubleClicked[0] && resize_grip_n == 0)
        {
            // Manual auto-fit when double-clicking
            size_target = CalcSizeAfterConstraint(window, size_auto_fit);
            ClearActiveID();
        }
        else if (held)
        {
            // Resize from any of the four corners
            // We don't use an incremental MouseDelta but rather compute an absolute target size based on mouse position
            ImVec2 corner_target = g.IO.MousePos - g.ActiveIdClickOffset + ImLerp(grip.InnerDir * grip_hover_outer_size, grip.InnerDir * -grip_hover_inner_size, grip.CornerPos); // Corner of the window corresponding to our corner grip
            CalcResizePosSizeFromAnyCorner(window, corner_target, grip.CornerPos, &pos_target, &size_target);
        }
        if (resize_grip_n == 0 || held || hovered)
            resize_grip_col[resize_grip_n] = GetColorU32(held ? ImGuiCol_ResizeGripActive : hovered ? ImGuiCol_ResizeGripHovered : ImGuiCol_ResizeGrip);
    }
    for (int border_n = 0; border_n < resize_border_count; border_n++)
    {
        bool hovered, held;
        ImRect border_rect = GetResizeBorderRect(window, border_n, grip_hover_inner_size, WINDOWS_RESIZE_FROM_EDGES_HALF_THICKNESS);
        ButtonBehavior(border_rect, window->GetID((void*)(intptr_t)(border_n + 4)), &hovered, &held, ImGuiButtonFlags_FlattenChildren);
        //GetOverlayDrawList(window)->AddRect(border_rect.Min, border_rect.Max, IM_COL32(255, 255, 0, 255));
        if ((hovered && g.HoveredIdTimer > WINDOWS_RESIZE_FROM_EDGES_FEEDBACK_TIMER) || held)
        {
            g.MouseCursor = (border_n & 1) ? ImGuiMouseCursor_ResizeEW : ImGuiMouseCursor_ResizeNS;
            if (held) *border_held = border_n;
        }
        if (held)
        {
            ImVec2 border_target = window->Pos;
            ImVec2 border_posn;
            if (border_n == 0) { border_posn = ImVec2(0, 0); border_target.y = (g.IO.MousePos.y - g.ActiveIdClickOffset.y + WINDOWS_RESIZE_FROM_EDGES_HALF_THICKNESS); }
            if (border_n == 1) { border_posn = ImVec2(1, 0); border_target.x = (g.IO.MousePos.x - g.ActiveIdClickOffset.x + WINDOWS_RESIZE_FROM_EDGES_HALF_THICKNESS); }
            if (border_n == 2) { border_posn = ImVec2(0, 1); border_target.y = (g.IO.MousePos.y - g.ActiveIdClickOffset.y + WINDOWS_RESIZE_FROM_EDGES_HALF_THICKNESS); }
            if (border_n == 3) { border_posn = ImVec2(0, 0); border_target.x = (g.IO.MousePos.x - g.ActiveIdClickOffset.x + WINDOWS_RESIZE_FROM_EDGES_HALF_THICKNESS); }
            CalcResizePosSizeFromAnyCorner(window, border_target, border_posn, &pos_target, &size_target);
        }
    }
    PopID();

    // Navigation resize (keyboard/gamepad)
    if (g.NavWindowingTarget && g.NavWindowingTarget->RootWindow == window)
    {
        ImVec2 nav_resize_delta;
        if (g.NavInputSource == ImGuiInputSource_NavKeyboard && g.IO.KeyShift)
            nav_resize_delta = GetNavInputAmount2d(ImGuiNavDirSourceFlags_Keyboard, ImGuiInputReadMode_Down);
        if (g.NavInputSource == ImGuiInputSource_NavGamepad)
            nav_resize_delta = GetNavInputAmount2d(ImGuiNavDirSourceFlags_PadDPad, ImGuiInputReadMode_Down);
        if (nav_resize_delta.x != 0.0f || nav_resize_delta.y != 0.0f)
        {
            const float NAV_RESIZE_SPEED = 600.0f;
            nav_resize_delta *= ImFloor(NAV_RESIZE_SPEED * g.IO.DeltaTime * ImMin(g.IO.DisplayFramebufferScale.x, g.IO.DisplayFramebufferScale.y));
            g.NavWindowingToggleLayer = false;
            g.NavDisableMouseHover = true;
            resize_grip_col[0] = GetColorU32(ImGuiCol_ResizeGripActive);
            // FIXME-NAV: Should store and accumulate into a separate size buffer to handle sizing constraints properly, right now a constraint will make us stuck.
            size_target = CalcSizeAfterConstraint(window, window->SizeFull + nav_resize_delta);
        }
    }

    // Apply back modified position/size to window
    if (size_target.x != FLT_MAX)
    {
        window->SizeFull = size_target;
        MarkIniSettingsDirty(window);
    }
    if (pos_target.x != FLT_MAX)
    {
        window->Pos = ImFloor(pos_target);
        MarkIniSettingsDirty(window);
    }

    window->Size = window->SizeFull;
}